

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImVec2 IVar1;
  char cVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  long lVar9;
  ImGuiTableCellData *pIVar10;
  ImU32 col;
  long lVar11;
  ImGuiTableCellData *pIVar12;
  ImU32 col_00;
  ImGuiTableColumn *pIVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  ImRect row_rect;
  ImVec2 local_78;
  ImVec2 local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ImU32 local_4c;
  undefined1 local_48 [16];
  ImVec2 local_38;
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4 != table->InnerWindow) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24f5,"TableEndRow","ImGui ASSERT FAILED: %s","window == table->InnerWindow");
  }
  if (table->IsInsideRow == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24f6,"TableEndRow","ImGui ASSERT FAILED: %s","table->IsInsideRow");
  }
  TableEndCell(table);
  fVar18 = table->RowPosY2;
  auVar21 = ZEXT416((uint)fVar18);
  (pIVar4->DC).CursorPos.y = fVar18;
  fVar24 = table->RowPosY1;
  iVar3 = table->CurrentRow;
  bVar6 = table->FreezeRowsCount < 1;
  bVar14 = iVar3 + 1 != (int)table->FreezeRowsCount;
  if (iVar3 == 0) {
    table->LastFirstRowHeight = fVar18 - fVar24;
  }
  if (((-1 < iVar3) && ((table->InnerClipRect).Min.y <= fVar18)) &&
     (fVar24 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_68 = fVar24;
    local_48 = auVar21;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
    }
    local_4c = 0;
    col = table->RowBgColor[1];
    if (table->RowBgColor[1] == 0x1000000) {
      col = 0;
    }
    if (((table->CurrentRow != 0) || (table->InnerWindow == table->OuterWindow)) &&
       ((local_4c = 0, 0 < table->CurrentRow && ((table->Flags & 0x80U) != 0)))) {
      local_4c = table->RowBgColor[(ulong)((table->field_0x96 & 1) == 0) + 2];
    }
    cVar2 = table->RowCellDataCount;
    if (('\0' < cVar2 || !bVar6 && !bVar14) || (local_4c != 0 || (col != 0 || col_00 != 0))) {
      fVar18 = (table->HostClipRect).Min.y;
      fVar24 = (table->HostClipRect).Max.x;
      fVar17 = (table->HostClipRect).Max.y;
      pIVar5 = pIVar4->DrawList;
      (pIVar5->_CmdHeader).ClipRect.x = (table->HostClipRect).Min.x;
      (pIVar5->_CmdHeader).ClipRect.y = fVar18;
      (pIVar5->_CmdHeader).ClipRect.z = fVar24;
      (pIVar5->_CmdHeader).ClipRect.w = fVar17;
      ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      fVar18 = (table->WorkRect).Min.x;
      fVar24 = (table->WorkRect).Max.x;
      IVar1 = (table->BackgroundClipRect).Min;
      fVar17 = IVar1.x;
      fVar25 = IVar1.y;
      uVar15 = -(uint)(fVar17 <= fVar18);
      uVar16 = -(uint)(fVar25 <= local_68);
      local_78 = (ImVec2)(CONCAT44(~uVar16 & (uint)fVar25,~uVar15 & (uint)fVar17) |
                         CONCAT44((uint)local_68 & uVar16,(uint)fVar18 & uVar15));
      auVar20._4_8_ = 0;
      auVar20._0_4_ = fVar24;
      auVar20._12_4_ = local_48._4_4_;
      auVar19._8_8_ = auVar20._8_8_;
      auVar19._4_4_ = local_48._0_4_;
      auVar19._0_4_ = fVar24;
      auVar21._8_8_ = 0;
      auVar21._0_4_ = (table->BackgroundClipRect).Max.x;
      auVar21._4_4_ = (table->BackgroundClipRect).Max.y;
      auVar21 = minps(auVar19,auVar21);
      local_70 = auVar21._0_8_;
      if (col_00 != 0) {
        local_70.y = auVar21._4_4_;
        bVar8 = local_78.y < local_70.y;
        if (bVar8) {
          ImDrawList::AddRectFilled(pIVar4->DrawList,&local_78,&local_70,col_00,0.0,0xf);
        }
      }
      if (col != 0) {
        if (local_78.y < local_70.y) {
          ImDrawList::AddRectFilled(pIVar4->DrawList,&local_78,&local_70,col,0.0,0xf);
        }
      }
    }
    if ('\0' < cVar2) {
      pIVar10 = (table->RowCellData).Data + (long)table->RowCellDataCount + -1;
      if ((table->RowCellData).DataEnd <= pIVar10) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
      }
      pIVar12 = (table->RowCellData).Data;
      if ((table->RowCellData).DataEnd <= pIVar12) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
      }
      for (; pIVar12 <= pIVar10; pIVar12 = pIVar12 + 1) {
        pIVar13 = (table->Columns).Data + pIVar12->Column;
        if ((table->Columns).DataEnd <= pIVar13) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        fVar18 = pIVar13->MinX - table->CellSpacingX;
        IVar1 = (table->BackgroundClipRect).Min;
        fVar24 = IVar1.x;
        fVar17 = IVar1.y;
        uVar15 = -(uint)(fVar24 <= fVar18);
        uVar16 = -(uint)(fVar17 <= local_68);
        local_78 = (ImVec2)(CONCAT44(~uVar16 & (uint)fVar17,~uVar15 & (uint)fVar24) |
                           CONCAT44((uint)local_68 & uVar16,(uint)fVar18 & uVar15));
        auVar23._4_8_ = 0;
        auVar23._0_4_ = pIVar13->MaxX;
        auVar23._12_4_ = local_48._4_4_;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._4_4_ = local_48._0_4_;
        auVar22._0_4_ = pIVar13->MaxX;
        auVar7._8_8_ = 0;
        auVar7._0_4_ = (table->BackgroundClipRect).Max.x;
        auVar7._4_4_ = (table->BackgroundClipRect).Max.y;
        auVar21 = minps(auVar22,auVar7);
        local_70 = auVar21._0_8_;
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_78,&local_70,pIVar12->BgColor,0.0,0xf);
      }
    }
    if (((local_4c != 0) && ((table->BackgroundClipRect).Min.y <= local_68)) &&
       (local_68 < (table->BackgroundClipRect).Max.y)) {
      local_78.y = local_68;
      local_78.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = local_68;
      ImDrawList::AddLine(pIVar4->DrawList,&local_78,&local_38,local_4c,1.0);
    }
    if (bVar6 || bVar14) goto LAB_001f21fa;
    if (((table->BackgroundClipRect).Min.y <= (float)local_48._0_4_) &&
       ((float)local_48._0_4_ < (table->BackgroundClipRect).Max.y)) {
      local_78.y = (float)local_48._0_4_;
      local_78.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_78,&local_38,table->BorderColorStrong,1.0);
    }
  }
  if (!bVar6 && !bVar14) {
    if (table->IsFreezeRowsPassed != false) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x255a,"TableEndRow","ImGui ASSERT FAILED: %s",
                  "table->IsFreezeRowsPassed == false");
    }
    table->IsFreezeRowsPassed = true;
    ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,0);
    fVar18 = table->RowPosY2;
    fVar24 = (pIVar4->InnerClipRect).Min.y;
    fVar17 = (pIVar4->InnerClipRect).Max.y;
    uVar15 = -(uint)(fVar24 <= fVar18 + 1.0);
    fVar25 = (float)(~uVar15 & (uint)fVar24 | (uint)(fVar18 + 1.0) & uVar15);
    fVar24 = (table->InnerClipRect).Max.x;
    (table->BackgroundClipRect).Min.x = (table->InnerClipRect).Min.x;
    (table->BackgroundClipRect).Min.y = fVar25;
    (table->BackgroundClipRect).Max.x = fVar24;
    (table->BackgroundClipRect).Max.y = fVar17;
    fVar24 = table->RowPosY1;
    fVar17 = (fVar18 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar4->DC).CursorPos.y = fVar17;
    table->RowPosY2 = fVar17;
    table->RowPosY1 = fVar17 - (fVar18 - fVar24);
    if (0 < table->ColumnsCount) {
      lVar9 = 0;
      lVar11 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      local_68 = fVar25;
      do {
        pIVar13 = (table->Columns).Data;
        if ((table->Columns).DataEnd <=
            (ImGuiTableColumn *)((long)&(pIVar13->ClipRect).Min.x + lVar9)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
          fVar25 = local_68;
        }
        (&pIVar13->DrawChannelCurrent)[lVar9] = (&pIVar13->DrawChannelRowsAfterFreeze)[lVar9];
        *(float *)((long)&(pIVar13->ClipRect).Min.y + lVar9) = fVar25;
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 0x68;
      } while (lVar11 < table->ColumnsCount);
    }
  }
LAB_001f21fa:
  if ((table->field_0x94 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void    ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    TableEndCell(table);

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;

    const bool unfreeze_rows = (table->CurrentRow + 1 == table->FreezeRowsCount && table->FreezeRowsCount > 0);

    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = table->CurrentRow >= 0 && bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y;
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow != 0 || table->InnerWindow == table->OuterWindow)
        {
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
            {
                //if (table->CurrentRow == 0 && table->InnerWindow == table->OuterWindow)
                //    border_col = table->BorderOuterColor;
                //else
                if (table->CurrentRow > 0)// && !(table->LastRowFlags & ImGuiTableRowFlags_Headers))
                    border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;
            }
            else
            {
                //if (table->RowFlags & ImGuiTableRowFlags_Headers)
                //    border_col = table->BorderOuterColor;
            }
        }

        const bool draw_cell_bg_color = table->RowCellDataCount > 0;
        const bool draw_strong_bottom_border = unfreeze_rows;// || (table->RowFlags & ImGuiTableRowFlags_Headers);
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeChannelChange() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            window->DrawList->_CmdHeader.ClipRect = table->HostClipRect.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, 0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BackgroundClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCount - 1];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_rect(column->MinX - table->CellSpacingX, bg_y1, column->MaxX, bg_y2); // FIXME-TABLE: Padding currently wrong until we finish the padding refactor
                cell_rect.ClipWith(table->BackgroundClipRect);
                window->DrawList->AddRectFilled(cell_rect.Min, cell_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BackgroundClipRect.Min.y && bg_y1 < table->BackgroundClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border)
            if (bg_y2 >= table->BackgroundClipRect.Min.y && bg_y2 < table->BackgroundClipRect.Max.y)
                window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows)
    {
        IM_ASSERT(table->IsFreezeRowsPassed == false);
        table->IsFreezeRowsPassed = true;
        table->DrawSplitter.SetCurrentChannel(window->DrawList, 0);

        ImRect r;
        r.Min.x = table->InnerClipRect.Min.x;
        r.Min.y = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        r.Max.x = table->InnerClipRect.Max.x;
        r.Max.y = window->InnerClipRect.Max.y;
        table->BackgroundClipRect = r;

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelRowsAfterFreeze;
            column->ClipRect.Min.y = r.Min.y;
        }
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}